

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktGeometryVaryingGeometryShaderTests.cpp
# Opt level: O1

TestInstance * __thiscall
vkt::geometry::anon_unknown_1::VaryingTest::createInstance(VaryingTest *this,Context *context)

{
  pointer pVVar1;
  GeometryExpanderRenderTestInstance *this_00;
  
  this_00 = (GeometryExpanderRenderTestInstance *)operator_new(0x70);
  GeometryExpanderRenderTestInstance::GeometryExpanderRenderTestInstance
            (this_00,context,VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP,
             (this->super_TestCase).super_TestCase.super_TestNode.m_name._M_dataplus._M_p);
  (this_00->super_TestInstance)._vptr_TestInstance =
       (_func_int **)&PTR__GeometryExpanderRenderTestInstance_00d7e580;
  this_00->m_numDrawVertices = 3;
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::resize
            (&this_00->m_vertexPosData,3);
  pVVar1 = (this_00->m_vertexPosData).
           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pVVar1->m_data[0] = 0.5;
  pVVar1->m_data[1] = 0.0;
  pVVar1->m_data[2] = 0.0;
  pVVar1->m_data[3] = 1.0;
  pVVar1 = (this_00->m_vertexPosData).
           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pVVar1[1].m_data[0] = 0.0;
  pVVar1[1].m_data[1] = 0.5;
  pVVar1[1].m_data[2] = 0.0;
  pVVar1[1].m_data[3] = 1.0;
  pVVar1 = (this_00->m_vertexPosData).
           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pVVar1[2].m_data[0] = 0.1;
  pVVar1[2].m_data[1] = 0.0;
  pVVar1[2].m_data[2] = 0.0;
  pVVar1[2].m_data[3] = 1.0;
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::resize
            (&this_00->m_vertexAttrData,(long)this_00->m_numDrawVertices);
  pVVar1 = (this_00->m_vertexAttrData).
           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pVVar1->m_data[0] = 0.7;
  pVVar1->m_data[1] = 0.4;
  pVVar1->m_data[2] = 0.6;
  pVVar1->m_data[3] = 1.0;
  pVVar1 = (this_00->m_vertexAttrData).
           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pVVar1[1].m_data[0] = 0.9;
  pVVar1[1].m_data[1] = 0.2;
  pVVar1[1].m_data[2] = 0.5;
  pVVar1[1].m_data[3] = 1.0;
  pVVar1 = (this_00->m_vertexAttrData).
           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pVVar1[2].m_data[0] = 0.1;
  pVVar1[2].m_data[1] = 0.8;
  pVVar1[2].m_data[2] = 0.3;
  pVVar1[2].m_data[3] = 1.0;
  return &this_00->super_TestInstance;
}

Assistant:

TestInstance* VaryingTest::createInstance (Context& context) const
{
	return new GeometryVaryingTestInstance(context, getName());
}